

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean swamp_effects(void)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  int damage;
  char *desc;
  boolean swampok;
  
  bVar1 = false;
  if ((u.uprops[0x27].extrinsic == 0) ||
     (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
    if ((uarmf != (obj *)0x0) &&
       ((obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
        (iVar3 = strncmp(obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr,"mud ",4), iVar3 == 0
        )))) {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  if (!bVar1) {
    if (u.utraptype != 5) {
      if (((((u.uprops[0x39].intrinsic == 0) && (u.uprops[0x39].extrinsic == 0)) &&
           (((youmonst.data)->mflags1 & 2) == 0)) &&
          ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) &&
         ((u.uprops[0x31].intrinsic == 0 &&
          ((u.uprops[0x31].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x600) == 0)))))) {
        u.utrap = rnd(3);
        u.utraptype = 5;
        pline("You step into the muddy swamp.");
      }
      else {
        Norep("You swim in the muddy water.");
      }
    }
    iVar3 = rn2(5);
    if (iVar3 == 0) {
      water_damage(invent,'\0','\0');
      pline("Your baggage gets wet.");
    }
    else if (uarmf != (obj *)0x0) {
      rust_dmg(uarmf,"boots",1,'\x01',&youmonst);
    }
  }
  if ((u.umonnum == 0x29) && (iVar3 = rn2(3), iVar3 != 0)) {
    split_mon(&youmonst,(monst *)0x0);
  }
  else if (u.umonnum == 0x10a) {
    iVar3 = rnd(6);
    pline("You rust!");
    if (iVar3 < u.mhmax) {
      u.mhmax = u.mhmax - iVar3;
    }
    losehp(iVar3,"rusting away",1);
  }
  return '\0';
}

Assistant:

boolean swamp_effects(void)
{
	boolean swampok = FALSE;

	if (Wwalking) {
	    swampok = TRUE;
	} else if (uarmf) {
	    const char *desc = OBJ_DESCR(objects[uarmf->otyp]);
	    if (desc && !strncmp(desc, "mud ", 4))
		swampok = TRUE;
	}

	if (!swampok) {
	    if (u.utraptype != TT_SWAMP) {
		if (!Swimming && !Amphibious) {
		    u.utrap = rnd(3);
		    u.utraptype = TT_SWAMP;
		    pline("You step into the muddy swamp.");
		} else {
		    Norep("You swim in the muddy water.");
		}
	    }
	    if (!rn2(5)) {
		water_damage(invent, FALSE, FALSE);
		pline("Your baggage gets wet.");
	    } else if (uarmf) {
		rust_dmg(uarmf, "boots", 1, TRUE, &youmonst);
	    }
	}

	if (u.umonnum == PM_GREMLIN && rn2(3)) {
	    split_mon(&youmonst, NULL);
	} else if (u.umonnum == PM_IRON_GOLEM) {
	    int damage = rnd(6);
	    pline("You rust!");
	    if (u.mhmax > damage) u.mhmax -= damage;
	    losehp(damage, "rusting away", KILLED_BY);
	}

	return FALSE;
}